

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O3

string * __thiscall
VvcVpsUnit::getDescription_abi_cxx11_(string *__return_storage_ptr__,VvcVpsUnit *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double fps;
  string local_48;
  double local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Frame rate: ","");
  uVar1 = this->num_units_in_tick;
  uVar2 = this->time_scale;
  local_28 = 0.0;
  if (uVar1 != 0) {
    local_28 = (double)(int)uVar2 / (double)(int)uVar1;
  }
  if ((local_28 != 0.0) || (NAN(local_28))) {
    doubleToStr_abi_cxx11_(&local_48,&local_28,-1);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"not found","");
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

string VvcVpsUnit::getDescription() const
{
    string rez("Frame rate: ");
    const double fps = getFPS();
    if (fps != 0.0)
        rez += doubleToStr(fps);
    else
        rez += string("not found");

    return rez;
}